

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMostDenseSeeds.cpp
# Opt level: O2

void RandomTrial(uint N,uint count,uint64_t seed,uint16_t d_seed,uint trial)

{
  undefined1 auVar1 [16];
  WirehairResult WVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PCGRandom local_138;
  Codec codec;
  
  local_138.State = 0;
  local_138.Inc = 0;
  siamese::PCGRandom::Seed(&local_138,seed,(ulong)trial);
  uVar3 = local_138.State * 0x5851f42d4c957f2d + local_138.Inc;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_138.State;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar3;
  auVar6 = vpunpcklqdq_avx(auVar5,auVar6);
  auVar5 = vpsrlvq_avx2(auVar6,_DAT_00108010);
  auVar1 = vpsrlvq_avx2(auVar6,_DAT_00108020);
  auVar6 = vpsrlq_avx(auVar6,0x3b);
  auVar6 = vpshufd_avx(auVar6,0xe8);
  local_138.State = uVar3 * 0x5851f42d4c957f2d + local_138.Inc;
  auVar5 = vpshufd_avx(auVar1 ^ auVar5,0xe8);
  auVar5 = vprorvd_avx512vl(auVar5,auVar6);
  auVar6 = vpshufd_avx(auVar5,0x55);
  uVar4 = vpextrw_avx(auVar5 ^ auVar6,0);
  wirehair::Codec::Codec(&codec);
  wirehair::Codec::OverrideSeeds(&codec,(uint16_t)count,(uint16_t)uVar4,d_seed);
  WVar2 = wirehair::Codec::InitializeEncoder(&codec,(ulong)N,1);
  if (WVar2 == Wirehair_Success) {
    WVar2 = wirehair::Codec::EncodeFeed
                      (&codec,message.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (WVar2 == Wirehair_Success) goto LAB_001018dc;
  }
  LOCK();
  FailedTrials.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 1);
  UNLOCK();
LAB_001018dc:
  wirehair::Codec::~Codec(&codec);
  return;
}

Assistant:

static void RandomTrial(
    unsigned N,
    unsigned count,
    uint64_t seed,
    const uint16_t d_seed,
    unsigned trial)
{
    const uint16_t dense_count = (uint16_t)count;

    siamese::PCGRandom prng;
    prng.Seed(seed, trial);

    const uint16_t p_seed = (uint16_t)(prng.Next() ^ prng.Next());

    wirehair::Codec codec;

    // Override the seeds
    codec.OverrideSeeds(dense_count, p_seed, d_seed);

    // Initialize codec
    WirehairResult result = codec.InitializeEncoder(N, 1);

    // If initialization succeeded:
    if (result == Wirehair_Success) {
        // Feed message to codec
        result = codec.EncodeFeed(&message[0]);
    }

    if (result != Wirehair_Success) {
        FailedTrials++;
    }
}